

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O2

plutovg_font_face_t *
plutovg_font_face_load_from_data
          (void *data,uint length,int ttcindex,plutovg_destroy_func_t destroy_func,void *closure)

{
  char cVar1;
  stbtt__buf sVar2;
  ushort uVar3;
  stbtt_uint32 sVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  stbtt_uint32 sVar8;
  stbtt_uint32 sVar9;
  stbtt_uint32 sVar10;
  ulong uVar11;
  long lVar12;
  plutovg_font_face_t *ppVar13;
  long lVar14;
  stbtt_uint32 encoding_record;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  stbtt__buf sVar19;
  stbtt__buf sVar20;
  uint local_e8;
  stbtt_uint32 local_d8;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 charstrings;
  stbtt_uint32 cstype;
  stbtt__buf local_c8;
  uint local_b8;
  stbtt_uint32 local_b4;
  stbtt_uint32 local_b0;
  stbtt_uint32 local_ac;
  stbtt_uint32 local_a8;
  stbtt_uint32 local_a4;
  stbtt__buf local_a0;
  stbtt__buf local_90;
  undefined8 local_80;
  uchar *local_78;
  uchar *local_70;
  undefined8 local_68;
  undefined8 local_60;
  uchar *local_58;
  undefined8 local_50;
  uchar *local_48;
  stbtt__buf local_40;
  
  cVar1 = *data;
  if (cVar1 == '\0') {
    if (*(char *)((long)data + 1) != '\x01') goto LAB_001037f3;
LAB_00103688:
    if ((*(char *)((long)data + 2) != '\0') || (*(char *)((long)data + 3) != '\0'))
    goto LAB_001037f3;
LAB_0010370e:
    sVar10 = -(uint)(ttcindex != 0);
  }
  else {
    if (cVar1 != 't') {
      if (cVar1 != 'O') {
        if ((cVar1 != '1') || (*(char *)((long)data + 1) != '\0')) goto LAB_001037f3;
        goto LAB_00103688;
      }
      if (((*(char *)((long)data + 1) != 'T') || (*(char *)((long)data + 2) != 'T')) ||
         (*(char *)((long)data + 3) != 'O')) goto LAB_001037f3;
      goto LAB_0010370e;
    }
    cVar1 = *(char *)((long)data + 1);
    if (cVar1 == 'r') {
      if ((*(char *)((long)data + 2) != 'u') || (*(char *)((long)data + 3) != 'e'))
      goto LAB_001037f3;
      goto LAB_0010370e;
    }
    if (cVar1 != 't') {
      if (((cVar1 != 'y') || (*(char *)((long)data + 2) != 'p')) ||
         (*(char *)((long)data + 3) != '1')) goto LAB_001037f3;
      goto LAB_0010370e;
    }
    if ((((*(char *)((long)data + 2) != 'c') || (*(char *)((long)data + 3) != 'f')) ||
        ((sVar10 = ttULONG((stbtt_uint8 *)((long)data + 4)), sVar10 != 0x20000 &&
         (sVar10 != 0x10000)))) ||
       (uVar15 = *(uint *)((long)data + 8),
       (int)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18) <=
       ttcindex)) goto LAB_001037f3;
    sVar10 = ttULONG((stbtt_uint8 *)((long)data + (long)(ttcindex << 2) + 0xc));
  }
  if (sVar10 != 0xffffffff) {
    sVar4 = stbtt__find_table((stbtt_uint8 *)data,sVar10,"cmap");
    sVar5 = stbtt__find_table((stbtt_uint8 *)data,sVar10,"loca");
    sVar6 = stbtt__find_table((stbtt_uint8 *)data,sVar10,"head");
    sVar7 = stbtt__find_table((stbtt_uint8 *)data,sVar10,"glyf");
    sVar8 = stbtt__find_table((stbtt_uint8 *)data,sVar10,"hhea");
    sVar9 = stbtt__find_table((stbtt_uint8 *)data,sVar10,"hmtx");
    local_ac = stbtt__find_table((stbtt_uint8 *)data,sVar10,"kern");
    local_b0 = stbtt__find_table((stbtt_uint8 *)data,sVar10,"GPOS");
    sVar19.cursor = (undefined4)local_60;
    sVar19.size = local_60._4_4_;
    sVar19.data = local_58;
    local_a8 = sVar9;
    local_a4 = sVar8;
    if ((sVar9 != 0 && sVar8 != 0) && (sVar6 != 0 && sVar4 != 0)) {
      if (sVar7 == 0) {
        charstrings = 0;
        fdarrayoff = 0;
        cstype = 2;
        local_d8 = 0;
        sVar8 = stbtt__find_table((stbtt_uint8 *)data,sVar10,"CFF ");
        if (sVar8 == 0) goto LAB_001037f3;
        local_c8.data = (uchar *)((ulong)sVar8 + (long)data);
        local_68 = 0x2000000000000000;
        local_c8.cursor = 0;
        local_c8.size = 0x20000000;
        local_70 = local_c8.data;
        stbtt__buf_skip(&local_c8,2);
        lVar12 = (long)local_c8.cursor;
        uVar15 = 0;
        if (local_c8.cursor < local_c8.size) {
          local_c8.cursor = local_c8.cursor + 1;
          uVar15 = (uint)local_c8.data[lVar12];
        }
        stbtt__buf_seek(&local_c8,uVar15);
        stbtt__cff_get_index(&local_c8);
        sVar19 = stbtt__cff_get_index(&local_c8);
        local_40 = stbtt__cff_index_get(sVar19,0);
        stbtt__cff_get_index(&local_c8);
        sVar19 = stbtt__cff_get_index(&local_c8);
        local_50 = sVar19._8_8_;
        local_48 = sVar19.data;
        stbtt__dict_get_ints(&local_40,0x11,1,&charstrings);
        stbtt__dict_get_ints(&local_40,0x106,1,&cstype);
        stbtt__dict_get_ints(&local_40,0x124,1,&fdarrayoff);
        stbtt__dict_get_ints(&local_40,0x125,1,&local_d8);
        sVar2.cursor = local_c8.cursor;
        sVar2.data = local_c8.data;
        sVar2.size = local_c8.size;
        sVar20 = stbtt__get_subrs(sVar2,local_40);
        sVar9 = charstrings;
        sVar8 = local_d8;
        if (charstrings == 0 || cstype != 2) goto LAB_001037f3;
        if (fdarrayoff == 0) {
          local_a0 = (stbtt__buf)ZEXT816(0);
          local_90 = (stbtt__buf)ZEXT816(0);
        }
        else {
          if (local_d8 == 0) goto LAB_001037f3;
          local_80 = sVar20._8_8_;
          local_78 = sVar20.data;
          stbtt__buf_seek(&local_c8,fdarrayoff);
          local_90 = stbtt__cff_get_index(&local_c8);
          local_a0 = stbtt__buf_range(&local_c8,sVar8,local_c8.size - sVar8);
          sVar20.cursor = (undefined4)local_80;
          sVar20.size = local_80._4_4_;
          sVar20.data = local_78;
        }
        local_80 = sVar20._8_8_;
        local_78 = sVar20.data;
        stbtt__buf_seek(&local_c8,sVar9);
        sVar19 = stbtt__cff_get_index(&local_c8);
      }
      else {
        if (sVar5 == 0) goto LAB_001037f3;
        local_68 = 0;
        local_70 = (uchar *)0x0;
      }
      local_60 = sVar19._8_8_;
      local_58 = sVar19.data;
      sVar8 = stbtt__find_table((stbtt_uint8 *)data,sVar10,"maxp");
      if (sVar8 == 0) {
        local_e8 = 0xffff;
      }
      else {
        uVar3 = *(ushort *)((long)data + (ulong)sVar8 + 4);
        local_e8 = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
      }
      uVar3 = *(ushort *)((long)data + (ulong)sVar4 + 2);
      uVar17 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
      uVar15 = sVar4 + 4;
      iVar16 = 0;
      local_b4 = sVar10;
      while (bVar18 = uVar17 != 0, uVar17 = uVar17 - 1, bVar18) {
        uVar11 = (ulong)uVar15;
        uVar3 = *(ushort *)((long)data + uVar11) << 8 | *(ushort *)((long)data + uVar11) >> 8;
        if ((uVar3 == 0) ||
           ((uVar3 == 3 &&
            ((uVar3 = *(ushort *)((long)data + uVar11 + 2), uVar3 = uVar3 << 8 | uVar3 >> 8,
             uVar3 == 10 || (uVar3 == 1)))))) {
          sVar10 = ttULONG((stbtt_uint8 *)((long)data + uVar11 + 4));
          iVar16 = sVar10 + sVar4;
        }
        uVar15 = uVar15 + 8;
      }
      if (iVar16 != 0) {
        lVar12 = (long)(int)sVar6;
        uVar3 = *(ushort *)((long)data + lVar12 + 0x32);
        local_b8 = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
        ppVar13 = (plutovg_font_face_t *)malloc(0x8d0);
        sVar2 = local_90;
        sVar19 = local_a0;
        ppVar13->ref_count = 1;
        (ppVar13->info).data = (uchar *)data;
        (ppVar13->info).fontstart = local_b4;
        (ppVar13->info).numGlyphs = local_e8;
        (ppVar13->info).loca = sVar5;
        (ppVar13->info).head = sVar6;
        (ppVar13->info).glyf = sVar7;
        (ppVar13->info).hhea = local_a4;
        (ppVar13->info).hmtx = local_a8;
        (ppVar13->info).kern = local_ac;
        (ppVar13->info).gpos = local_b0;
        (ppVar13->info).svg = -1;
        (ppVar13->info).index_map = iVar16;
        (ppVar13->info).indexToLocFormat = local_b8;
        (ppVar13->info).cff.data = local_70;
        (ppVar13->info).cff.cursor = (undefined4)local_68;
        (ppVar13->info).cff.size = local_68._4_4_;
        (ppVar13->info).charstrings.data = local_58;
        (ppVar13->info).charstrings.cursor = (undefined4)local_60;
        (ppVar13->info).charstrings.size = local_60._4_4_;
        (ppVar13->info).gsubrs.data = local_48;
        (ppVar13->info).gsubrs.cursor = (undefined4)local_50;
        (ppVar13->info).gsubrs.size = local_50._4_4_;
        (ppVar13->info).subrs.data = local_78;
        (ppVar13->info).subrs.cursor = (undefined4)local_80;
        (ppVar13->info).subrs.size = local_80._4_4_;
        (ppVar13->info).fontdicts.data = local_90.data;
        (ppVar13->info).fontdicts.cursor = local_90.cursor;
        (ppVar13->info).fontdicts.size = local_90.size;
        (ppVar13->info).fdselect.data = local_a0.data;
        (ppVar13->info).fdselect.cursor = local_a0.cursor;
        (ppVar13->info).fdselect.size = local_a0.size;
        lVar14 = (long)(int)local_a4;
        ppVar13->ascent =
             (int)(short)((ushort)*(byte *)((long)data + lVar14 + 4) << 8) |
             (uint)*(byte *)((long)data + lVar14 + 5);
        ppVar13->descent =
             (int)(short)((ushort)*(byte *)((long)data + lVar14 + 6) << 8) |
             (uint)*(byte *)((long)data + lVar14 + 7);
        ppVar13->line_gap =
             (int)(short)((ushort)*(byte *)((long)data + lVar14 + 8) << 8) |
             (uint)*(byte *)((long)data + lVar14 + 9);
        ppVar13->x1 = (int)(short)((ushort)*(byte *)((long)data + lVar12 + 0x24) << 8) |
                      (uint)*(byte *)((long)data + lVar12 + 0x25);
        ppVar13->y1 = (int)(short)((ushort)*(byte *)((long)data + lVar12 + 0x26) << 8) |
                      (uint)*(byte *)((long)data + lVar12 + 0x27);
        ppVar13->x2 = (int)(short)((ushort)*(byte *)((long)data + lVar12 + 0x28) << 8) |
                      (uint)*(byte *)((long)data + lVar12 + 0x29);
        ppVar13->y2 = (int)(short)((ushort)*(byte *)((long)data + lVar12 + 0x2a) << 8) |
                      (uint)*(byte *)((long)data + lVar12 + 0x2b);
        local_a0 = sVar19;
        local_90 = sVar2;
        memset(ppVar13->glyphs,0,0x800);
        ppVar13->destroy_func = destroy_func;
        ppVar13->closure = closure;
        return ppVar13;
      }
    }
  }
LAB_001037f3:
  if (destroy_func != (plutovg_destroy_func_t)0x0) {
    (*destroy_func)(closure);
  }
  return (plutovg_font_face_t *)0x0;
}

Assistant:

plutovg_font_face_t* plutovg_font_face_load_from_data(const void* data, unsigned int length, int ttcindex, plutovg_destroy_func_t destroy_func, void* closure)
{
    stbtt_fontinfo info;
    int offset = stbtt_GetFontOffsetForIndex(data, ttcindex);
    if(offset == -1 || !stbtt_InitFont(&info, data, offset)) {
        if(destroy_func)
            destroy_func(closure);
        return NULL;
    }

    plutovg_font_face_t* face = malloc(sizeof(plutovg_font_face_t));
    face->ref_count = 1;
    face->info = info;
    stbtt_GetFontVMetrics(&face->info, &face->ascent, &face->descent, &face->line_gap);
    stbtt_GetFontBoundingBox(&face->info, &face->x1, &face->y1, &face->x2, &face->y2);
    memset(face->glyphs, 0, sizeof(face->glyphs));
    face->destroy_func = destroy_func;
    face->closure = closure;
    return face;
}